

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gtest.cc
# Opt level: O2

void testing::internal::JsonUnitTestResultPrinter::OutputJsonTestSuiteForTestResult
               (ostream *stream,TestResult *result)

{
  ostream *poVar1;
  size_t in_RDX;
  size_t width;
  size_t width_00;
  size_t extraout_RDX;
  size_t width_01;
  size_t width_02;
  size_t width_03;
  size_t width_04;
  TimeInMillis ms;
  size_t width_05;
  TimeInMillis ms_00;
  size_t width_06;
  size_t extraout_RDX_00;
  size_t width_07;
  size_t width_08;
  size_t width_09;
  size_t width_10;
  size_t width_11;
  TimeInMillis ms_01;
  size_t width_12;
  TimeInMillis ms_02;
  size_t width_13;
  size_t width_14;
  size_t width_15;
  size_t width_16;
  size_t width_17;
  string local_a8;
  string local_88;
  string local_68;
  string local_48;
  allocator<char> local_23;
  allocator<char> local_22;
  allocator<char> local_21;
  
  Indent_abi_cxx11_(&local_48,(internal *)0x4,in_RDX);
  poVar1 = std::operator<<(stream,(string *)&local_48);
  std::operator<<(poVar1,"{\n");
  std::__cxx11::string::~string((string *)&local_48);
  std::__cxx11::string::string<std::allocator<char>>((string *)&local_48,"testsuite",&local_21);
  std::__cxx11::string::string<std::allocator<char>>((string *)&local_68,"name",&local_22);
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_88,"NonTestSuiteFailure",&local_23);
  Indent_abi_cxx11_(&local_a8,(internal *)0x6,width);
  OutputJsonKey(stream,&local_48,&local_68,&local_88,&local_a8,true);
  std::__cxx11::string::~string((string *)&local_a8);
  std::__cxx11::string::~string((string *)&local_88);
  std::__cxx11::string::~string((string *)&local_68);
  std::__cxx11::string::~string((string *)&local_48);
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_48,"testsuite",(allocator<char> *)&local_a8);
  std::__cxx11::string::string<std::allocator<char>>((string *)&local_68,"tests",&local_21);
  Indent_abi_cxx11_(&local_88,(internal *)0x6,width_00);
  OutputJsonKey(stream,&local_48,&local_68,1,&local_88,true);
  std::__cxx11::string::~string((string *)&local_88);
  std::__cxx11::string::~string((string *)&local_68);
  std::__cxx11::string::~string((string *)&local_48);
  width_07 = extraout_RDX;
  if (FLAGS_gtest_list_tests == '\0') {
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)&local_48,"testsuite",(allocator<char> *)&local_a8);
    std::__cxx11::string::string<std::allocator<char>>((string *)&local_68,"failures",&local_21);
    Indent_abi_cxx11_(&local_88,(internal *)0x6,width_01);
    OutputJsonKey(stream,&local_48,&local_68,1,&local_88,true);
    std::__cxx11::string::~string((string *)&local_88);
    std::__cxx11::string::~string((string *)&local_68);
    std::__cxx11::string::~string((string *)&local_48);
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)&local_48,"testsuite",(allocator<char> *)&local_a8);
    std::__cxx11::string::string<std::allocator<char>>((string *)&local_68,"disabled",&local_21);
    Indent_abi_cxx11_(&local_88,(internal *)0x6,width_02);
    OutputJsonKey(stream,&local_48,&local_68,0,&local_88,true);
    std::__cxx11::string::~string((string *)&local_88);
    std::__cxx11::string::~string((string *)&local_68);
    std::__cxx11::string::~string((string *)&local_48);
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)&local_48,"testsuite",(allocator<char> *)&local_a8);
    std::__cxx11::string::string<std::allocator<char>>((string *)&local_68,"skipped",&local_21);
    Indent_abi_cxx11_(&local_88,(internal *)0x6,width_03);
    OutputJsonKey(stream,&local_48,&local_68,0,&local_88,true);
    std::__cxx11::string::~string((string *)&local_88);
    std::__cxx11::string::~string((string *)&local_68);
    std::__cxx11::string::~string((string *)&local_48);
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)&local_48,"testsuite",(allocator<char> *)&local_a8);
    std::__cxx11::string::string<std::allocator<char>>((string *)&local_68,"errors",&local_21);
    Indent_abi_cxx11_(&local_88,(internal *)0x6,width_04);
    OutputJsonKey(stream,&local_48,&local_68,0,&local_88,true);
    std::__cxx11::string::~string((string *)&local_88);
    std::__cxx11::string::~string((string *)&local_68);
    std::__cxx11::string::~string((string *)&local_48);
    std::__cxx11::string::string<std::allocator<char>>((string *)&local_48,"testsuite",&local_21);
    std::__cxx11::string::string<std::allocator<char>>((string *)&local_68,"time",&local_22);
    FormatTimeInMillisAsDuration_abi_cxx11_(&local_88,(internal *)result->elapsed_time_,ms);
    Indent_abi_cxx11_(&local_a8,(internal *)0x6,width_05);
    OutputJsonKey(stream,&local_48,&local_68,&local_88,&local_a8,true);
    std::__cxx11::string::~string((string *)&local_a8);
    std::__cxx11::string::~string((string *)&local_88);
    std::__cxx11::string::~string((string *)&local_68);
    std::__cxx11::string::~string((string *)&local_48);
    std::__cxx11::string::string<std::allocator<char>>((string *)&local_48,"testsuite",&local_21);
    std::__cxx11::string::string<std::allocator<char>>((string *)&local_68,"timestamp",&local_22);
    FormatEpochTimeInMillisAsRFC3339_abi_cxx11_
              (&local_88,(internal *)result->start_timestamp_,ms_00);
    Indent_abi_cxx11_(&local_a8,(internal *)0x6,width_06);
    OutputJsonKey(stream,&local_48,&local_68,&local_88,&local_a8,true);
    std::__cxx11::string::~string((string *)&local_a8);
    std::__cxx11::string::~string((string *)&local_88);
    std::__cxx11::string::~string((string *)&local_68);
    std::__cxx11::string::~string((string *)&local_48);
    width_07 = extraout_RDX_00;
  }
  Indent_abi_cxx11_(&local_48,(internal *)0x6,width_07);
  poVar1 = std::operator<<(stream,(string *)&local_48);
  std::operator<<(poVar1,"\"testsuite\": [\n");
  std::__cxx11::string::~string((string *)&local_48);
  Indent_abi_cxx11_(&local_48,(internal *)0x8,width_08);
  poVar1 = std::operator<<(stream,(string *)&local_48);
  std::operator<<(poVar1,"{\n");
  std::__cxx11::string::~string((string *)&local_48);
  std::__cxx11::string::string<std::allocator<char>>((string *)&local_48,"testcase",&local_21);
  std::__cxx11::string::string<std::allocator<char>>((string *)&local_68,"name",&local_22);
  std::__cxx11::string::string<std::allocator<char>>((string *)&local_88,"",&local_23);
  Indent_abi_cxx11_(&local_a8,(internal *)0xa,width_09);
  OutputJsonKey(stream,&local_48,&local_68,&local_88,&local_a8,true);
  std::__cxx11::string::~string((string *)&local_a8);
  std::__cxx11::string::~string((string *)&local_88);
  std::__cxx11::string::~string((string *)&local_68);
  std::__cxx11::string::~string((string *)&local_48);
  std::__cxx11::string::string<std::allocator<char>>((string *)&local_48,"testcase",&local_21);
  std::__cxx11::string::string<std::allocator<char>>((string *)&local_68,"status",&local_22);
  std::__cxx11::string::string<std::allocator<char>>((string *)&local_88,"RUN",&local_23);
  Indent_abi_cxx11_(&local_a8,(internal *)0xa,width_10);
  OutputJsonKey(stream,&local_48,&local_68,&local_88,&local_a8,true);
  std::__cxx11::string::~string((string *)&local_a8);
  std::__cxx11::string::~string((string *)&local_88);
  std::__cxx11::string::~string((string *)&local_68);
  std::__cxx11::string::~string((string *)&local_48);
  std::__cxx11::string::string<std::allocator<char>>((string *)&local_48,"testcase",&local_21);
  std::__cxx11::string::string<std::allocator<char>>((string *)&local_68,"result",&local_22);
  std::__cxx11::string::string<std::allocator<char>>((string *)&local_88,"COMPLETED",&local_23);
  Indent_abi_cxx11_(&local_a8,(internal *)0xa,width_11);
  OutputJsonKey(stream,&local_48,&local_68,&local_88,&local_a8,true);
  std::__cxx11::string::~string((string *)&local_a8);
  std::__cxx11::string::~string((string *)&local_88);
  std::__cxx11::string::~string((string *)&local_68);
  std::__cxx11::string::~string((string *)&local_48);
  std::__cxx11::string::string<std::allocator<char>>((string *)&local_48,"testcase",&local_21);
  std::__cxx11::string::string<std::allocator<char>>((string *)&local_68,"timestamp",&local_22);
  FormatEpochTimeInMillisAsRFC3339_abi_cxx11_(&local_88,(internal *)result->start_timestamp_,ms_01);
  Indent_abi_cxx11_(&local_a8,(internal *)0xa,width_12);
  OutputJsonKey(stream,&local_48,&local_68,&local_88,&local_a8,true);
  std::__cxx11::string::~string((string *)&local_a8);
  std::__cxx11::string::~string((string *)&local_88);
  std::__cxx11::string::~string((string *)&local_68);
  std::__cxx11::string::~string((string *)&local_48);
  std::__cxx11::string::string<std::allocator<char>>((string *)&local_48,"testcase",&local_21);
  std::__cxx11::string::string<std::allocator<char>>((string *)&local_68,"time",&local_22);
  FormatTimeInMillisAsDuration_abi_cxx11_(&local_88,(internal *)result->elapsed_time_,ms_02);
  Indent_abi_cxx11_(&local_a8,(internal *)0xa,width_13);
  OutputJsonKey(stream,&local_48,&local_68,&local_88,&local_a8,true);
  std::__cxx11::string::~string((string *)&local_a8);
  std::__cxx11::string::~string((string *)&local_88);
  std::__cxx11::string::~string((string *)&local_68);
  std::__cxx11::string::~string((string *)&local_48);
  std::__cxx11::string::string<std::allocator<char>>((string *)&local_48,"testcase",&local_21);
  std::__cxx11::string::string<std::allocator<char>>((string *)&local_68,"classname",&local_22);
  std::__cxx11::string::string<std::allocator<char>>((string *)&local_88,"",&local_23);
  Indent_abi_cxx11_(&local_a8,(internal *)0xa,width_14);
  OutputJsonKey(stream,&local_48,&local_68,&local_88,&local_a8,false);
  std::__cxx11::string::~string((string *)&local_a8);
  std::__cxx11::string::~string((string *)&local_88);
  std::__cxx11::string::~string((string *)&local_68);
  std::__cxx11::string::~string((string *)&local_48);
  Indent_abi_cxx11_(&local_68,(internal *)0xa,width_15);
  TestPropertiesAsJson(&local_48,result,&local_68);
  std::operator<<(stream,(string *)&local_48);
  std::__cxx11::string::~string((string *)&local_48);
  std::__cxx11::string::~string((string *)&local_68);
  OutputJsonTestResult(stream,result);
  poVar1 = std::operator<<(stream,"\n");
  Indent_abi_cxx11_(&local_48,(internal *)0x6,width_16);
  poVar1 = std::operator<<(poVar1,(string *)&local_48);
  poVar1 = std::operator<<(poVar1,"]\n");
  Indent_abi_cxx11_(&local_68,(internal *)0x4,width_17);
  poVar1 = std::operator<<(poVar1,(string *)&local_68);
  std::operator<<(poVar1,"}");
  std::__cxx11::string::~string((string *)&local_68);
  std::__cxx11::string::~string((string *)&local_48);
  return;
}

Assistant:

void JsonUnitTestResultPrinter::OutputJsonTestSuiteForTestResult(
    ::std::ostream* stream, const TestResult& result) {
  // Output the boilerplate for a new test suite.
  *stream << Indent(4) << "{\n";
  OutputJsonKey(stream, "testsuite", "name", "NonTestSuiteFailure", Indent(6));
  OutputJsonKey(stream, "testsuite", "tests", 1, Indent(6));
  if (!GTEST_FLAG(list_tests)) {
    OutputJsonKey(stream, "testsuite", "failures", 1, Indent(6));
    OutputJsonKey(stream, "testsuite", "disabled", 0, Indent(6));
    OutputJsonKey(stream, "testsuite", "skipped", 0, Indent(6));
    OutputJsonKey(stream, "testsuite", "errors", 0, Indent(6));
    OutputJsonKey(stream, "testsuite", "time",
                  FormatTimeInMillisAsDuration(result.elapsed_time()),
                  Indent(6));
    OutputJsonKey(stream, "testsuite", "timestamp",
                  FormatEpochTimeInMillisAsRFC3339(result.start_timestamp()),
                  Indent(6));
  }
  *stream << Indent(6) << "\"testsuite\": [\n";

  // Output the boilerplate for a new test case.
  *stream << Indent(8) << "{\n";
  OutputJsonKey(stream, "testcase", "name", "", Indent(10));
  OutputJsonKey(stream, "testcase", "status", "RUN", Indent(10));
  OutputJsonKey(stream, "testcase", "result", "COMPLETED", Indent(10));
  OutputJsonKey(stream, "testcase", "timestamp",
                FormatEpochTimeInMillisAsRFC3339(result.start_timestamp()),
                Indent(10));
  OutputJsonKey(stream, "testcase", "time",
                FormatTimeInMillisAsDuration(result.elapsed_time()),
                Indent(10));
  OutputJsonKey(stream, "testcase", "classname", "", Indent(10), false);
  *stream << TestPropertiesAsJson(result, Indent(10));

  // Output the actual test result.
  OutputJsonTestResult(stream, result);

  // Finish the test suite.
  *stream << "\n" << Indent(6) << "]\n" << Indent(4) << "}";
}